

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_acs.cpp
# Opt level: O0

void FBehavior::StaticLockLevelVarStrings(void)

{
  bool bVar1;
  uint uVar2;
  FBehavior **ppFVar3;
  DACSThinker *pDVar4;
  DLevelScript *local_18;
  DLevelScript *script;
  DWORD modnum;
  
  for (script._4_4_ = 0; uVar2 = TArray<FBehavior_*,_FBehavior_*>::Size(&StaticModules),
      script._4_4_ < uVar2; script._4_4_ = script._4_4_ + 1) {
    ppFVar3 = TArray<FBehavior_*,_FBehavior_*>::operator[](&StaticModules,(ulong)script._4_4_);
    LockMapVarStrings(*ppFVar3);
  }
  bVar1 = TObjPtr<DACSThinker>::operator!=(&DACSThinker::ActiveThinker,(DACSThinker *)0x0);
  if (bVar1) {
    pDVar4 = TObjPtr<DACSThinker>::operator->(&DACSThinker::ActiveThinker);
    for (local_18 = pDVar4->Scripts; local_18 != (DLevelScript *)0x0;
        local_18 = DLevelScript::GetNext(local_18)) {
      DLevelScript::LockLocalVarStrings(local_18);
    }
  }
  return;
}

Assistant:

void FBehavior::StaticLockLevelVarStrings()
{
	// Lock map variables.
	for (DWORD modnum = 0; modnum < StaticModules.Size(); ++modnum)
	{
		StaticModules[modnum]->LockMapVarStrings();
	}
	// Lock running scripts' local variables.
	if (DACSThinker::ActiveThinker != NULL)
	{
		for (DLevelScript *script = DACSThinker::ActiveThinker->Scripts; script != NULL; script = script->GetNext())
		{
			script->LockLocalVarStrings();
		}
	}
}